

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

Node * __thiscall Patch::splay_node_starting_before<Patch::NewCoordinates>(Patch *this,Point target)

{
  bool bVar1;
  Point local_58;
  Point local_50;
  Point node_end;
  Point local_40;
  Point node_start;
  size_t splayed_node_ancestor_count;
  Node *node;
  Point left_ancestor_end;
  Node *splayed_node;
  Patch *this_local;
  Point target_local;
  
  left_ancestor_end.row = 0;
  left_ancestor_end.column = 0;
  this_local = (Patch *)target;
  Point::Point((Point *)&node);
  splayed_node_ancestor_count = (size_t)this->root;
  std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::clear(&this->node_stack);
  node_start.row = 0;
  node_start.column = 0;
  while (splayed_node_ancestor_count != 0) {
    node_end = NewCoordinates::distance_from_left_ancestor((Node *)splayed_node_ancestor_count);
    local_40 = Point::traverse((Point *)&node,&node_end);
    local_58 = NewCoordinates::extent((Node *)splayed_node_ancestor_count);
    local_50 = Point::traverse(&local_40,&local_58);
    bVar1 = Point::operator<=(&local_40,(Point *)&this_local);
    if (bVar1) {
      left_ancestor_end.row = (undefined4)splayed_node_ancestor_count;
      left_ancestor_end.column = splayed_node_ancestor_count._4_4_;
      node_start = (Point)std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::size
                                    (&this->node_stack);
      if (*(long *)(splayed_node_ancestor_count + 8) == 0) break;
      node = (Node *)local_50;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                (&this->node_stack,(value_type *)&splayed_node_ancestor_count);
      splayed_node_ancestor_count = *(size_t *)(splayed_node_ancestor_count + 8);
    }
    else {
      if (*(long *)splayed_node_ancestor_count == 0) break;
      std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::push_back
                (&this->node_stack,(value_type *)&splayed_node_ancestor_count);
      splayed_node_ancestor_count = *(size_t *)splayed_node_ancestor_count;
    }
  }
  if (left_ancestor_end != (Point)0x0) {
    std::vector<Patch::Node_*,_std::allocator<Patch::Node_*>_>::resize
              (&this->node_stack,(size_type)node_start);
    splay_node(this,(Node *)left_ancestor_end);
  }
  return (Node *)left_ancestor_end;
}

Assistant:

Patch::Node *Patch::splay_node_starting_before(Point target) {
  Node *splayed_node = nullptr;
  Point left_ancestor_end = Point();
  Node *node = root;

  node_stack.clear();
  size_t splayed_node_ancestor_count = 0;
  while (node) {
    Point node_start = left_ancestor_end.traverse(
        CoordinateSpace::distance_from_left_ancestor(node));
    Point node_end = node_start.traverse(CoordinateSpace::extent(node));
    if (node_start <= target) {
      splayed_node = node;
      splayed_node_ancestor_count = node_stack.size();
      if (node->right) {
        left_ancestor_end = node_end;
        node_stack.push_back(node);
        node = node->right;
      } else {
        break;
      }
    } else {
      if (node->left) {
        node_stack.push_back(node);
        node = node->left;
      } else {
        break;
      }
    }
  }

  if (splayed_node) {
    node_stack.resize(splayed_node_ancestor_count);
    splay_node(splayed_node);
  }

  return splayed_node;
}